

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_block.cc
# Opt level: O0

bool __thiscall
leveldb::FilterBlockReader::KeyMayMatch(FilterBlockReader *this,uint64_t block_offset,Slice *key)

{
  byte bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  undefined8 in_RDX;
  ulong in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  uint32_t limit;
  uint32_t start;
  uint64_t index;
  Slice filter;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  bool local_19;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI >> ((byte)*(undefined8 *)(in_RDI + 0x20) & 0x3f) < *(ulong *)(in_RDI + 0x18)) {
    uVar2 = DecodeFixed32(in_RDI);
    uVar3 = DecodeFixed32(in_RDI);
    if ((uVar2 <= uVar3) &&
       ((ulong)uVar3 <= (ulong)(*(long *)(in_RDI + 0x10) - *(long *)(in_RDI + 8)))) {
      Slice::Slice((Slice *)CONCAT44(uVar2,uVar3),in_RDI,
                   CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
      bVar1 = (**(code **)(**(long **)in_RDI + 0x20))(*(long **)in_RDI,in_RDX,local_18);
      local_19 = (bool)(bVar1 & 1);
      goto LAB_018de129;
    }
    if (uVar2 == uVar3) {
      local_19 = false;
      goto LAB_018de129;
    }
  }
  local_19 = true;
LAB_018de129:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_19;
}

Assistant:

bool FilterBlockReader::KeyMayMatch(uint64_t block_offset, const Slice& key) {
  uint64_t index = block_offset >> base_lg_;
  if (index < num_) {
    uint32_t start = DecodeFixed32(offset_ + index * 4);
    uint32_t limit = DecodeFixed32(offset_ + index * 4 + 4);
    if (start <= limit && limit <= static_cast<size_t>(offset_ - data_)) {
      Slice filter = Slice(data_ + start, limit - start);
      return policy_->KeyMayMatch(key, filter);
    } else if (start == limit) {
      // Empty filters do not match any keys
      return false;
    }
  }
  return true;  // Errors are treated as potential matches
}